

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Parse.cpp
# Opt level: O1

void __thiscall Parser::InitPids(Parser *this)

{
  HashTbl *this_00;
  IdentPtr pIVar1;
  
  this_00 = &(this->m_scan).m_htbl;
  pIVar1 = HashTbl::PidHashNameLen<char16_t>(this_00,g_ssym_arguments.sz,9);
  (this->wellKnownPropertyPids).arguments = pIVar1;
  pIVar1 = HashTbl::PidHashNameLen<char16_t>(this_00,g_ssym_async.sz,5);
  (this->wellKnownPropertyPids).async = pIVar1;
  pIVar1 = HashTbl::PidHashNameLen<char16_t>(this_00,g_ssym_eval.sz,4);
  (this->wellKnownPropertyPids).eval = pIVar1;
  pIVar1 = HashTbl::PidHashNameLen<char16_t>(this_00,g_ssym_get.sz,3);
  (this->wellKnownPropertyPids).get = pIVar1;
  pIVar1 = HashTbl::PidHashNameLen<char16_t>(this_00,g_ssym_set.sz,3);
  (this->wellKnownPropertyPids).set = pIVar1;
  pIVar1 = HashTbl::PidHashNameLen<char16_t>(this_00,g_ssym_let.sz,3);
  (this->wellKnownPropertyPids).let = pIVar1;
  pIVar1 = HashTbl::PidHashNameLen<char16_t>(this_00,g_ssym_await.sz,5);
  (this->wellKnownPropertyPids).await = pIVar1;
  pIVar1 = HashTbl::PidHashNameLen<char16_t>(this_00,g_ssym_constructor.sz,0xb);
  (this->wellKnownPropertyPids).constructor = pIVar1;
  pIVar1 = HashTbl::PidHashNameLen<char16_t>(this_00,g_ssym_prototype.sz,9);
  (this->wellKnownPropertyPids).prototype = pIVar1;
  pIVar1 = HashTbl::PidHashNameLen<char16_t>(this_00,L"__proto__",9);
  (this->wellKnownPropertyPids).__proto__ = pIVar1;
  pIVar1 = HashTbl::PidHashNameLen<char16_t>(this_00,L"of",2);
  (this->wellKnownPropertyPids).of = pIVar1;
  pIVar1 = HashTbl::PidHashNameLen<char16_t>(this_00,L"target",6);
  (this->wellKnownPropertyPids).target = pIVar1;
  pIVar1 = HashTbl::PidHashNameLen<char16_t>(this_00,L"meta",4);
  (this->wellKnownPropertyPids).meta = pIVar1;
  pIVar1 = HashTbl::PidHashNameLen<char16_t>(this_00,L"as",2);
  (this->wellKnownPropertyPids).as = pIVar1;
  pIVar1 = HashTbl::PidHashNameLen<char16_t>(this_00,L"from",4);
  (this->wellKnownPropertyPids).from = pIVar1;
  pIVar1 = HashTbl::PidHashNameLen<char16_t>(this_00,L"default",7);
  (this->wellKnownPropertyPids)._default = pIVar1;
  pIVar1 = HashTbl::PidHashNameLen<char16_t>(this_00,L"*",1);
  (this->wellKnownPropertyPids)._star = pIVar1;
  pIVar1 = HashTbl::PidHashNameLen<char16_t>(this_00,L"*this*",6);
  (this->wellKnownPropertyPids)._this = pIVar1;
  pIVar1 = HashTbl::PidHashNameLen<char16_t>(this_00,L"*new.target*",0xc);
  (this->wellKnownPropertyPids)._newTarget = pIVar1;
  pIVar1 = HashTbl::PidHashNameLen<char16_t>(this_00,L"*super*",7);
  (this->wellKnownPropertyPids)._super = pIVar1;
  pIVar1 = HashTbl::PidHashNameLen<char16_t>(this_00,L"*superconstructor*",0x12);
  (this->wellKnownPropertyPids)._superConstructor = pIVar1;
  pIVar1 = HashTbl::PidHashNameLen<char16_t>(this_00,L"*import.meta*",0xd);
  (this->wellKnownPropertyPids)._importMeta = pIVar1;
  return;
}

Assistant:

void Parser::InitPids()
{
    wellKnownPropertyPids.arguments = this->GetHashTbl()->PidHashNameLen(g_ssym_arguments.sz, g_ssym_arguments.cch);
    wellKnownPropertyPids.async = this->GetHashTbl()->PidHashNameLen(g_ssym_async.sz, g_ssym_async.cch);
    wellKnownPropertyPids.eval = this->GetHashTbl()->PidHashNameLen(g_ssym_eval.sz, g_ssym_eval.cch);
    wellKnownPropertyPids.get = this->GetHashTbl()->PidHashNameLen(g_ssym_get.sz, g_ssym_get.cch);
    wellKnownPropertyPids.set = this->GetHashTbl()->PidHashNameLen(g_ssym_set.sz, g_ssym_set.cch);
    wellKnownPropertyPids.let = this->GetHashTbl()->PidHashNameLen(g_ssym_let.sz, g_ssym_let.cch);
    wellKnownPropertyPids.await = this->GetHashTbl()->PidHashNameLen(g_ssym_await.sz, g_ssym_await.cch);
    wellKnownPropertyPids.constructor = this->GetHashTbl()->PidHashNameLen(g_ssym_constructor.sz, g_ssym_constructor.cch);
    wellKnownPropertyPids.prototype = this->GetHashTbl()->PidHashNameLen(g_ssym_prototype.sz, g_ssym_prototype.cch);
    wellKnownPropertyPids.__proto__ = this->GetHashTbl()->PidHashNameLen(_u("__proto__"), sizeof("__proto__") - 1);
    wellKnownPropertyPids.of = this->GetHashTbl()->PidHashNameLen(_u("of"), sizeof("of") - 1);
    wellKnownPropertyPids.target = this->GetHashTbl()->PidHashNameLen(_u("target"), sizeof("target") - 1);
    wellKnownPropertyPids.meta = this->GetHashTbl()->PidHashNameLen(_u("meta"), sizeof("meta") - 1);
    wellKnownPropertyPids.as = this->GetHashTbl()->PidHashNameLen(_u("as"), sizeof("as") - 1);
    wellKnownPropertyPids.from = this->GetHashTbl()->PidHashNameLen(_u("from"), sizeof("from") - 1);
    wellKnownPropertyPids._default = this->GetHashTbl()->PidHashNameLen(_u("default"), sizeof("default") - 1);
    wellKnownPropertyPids._star = this->GetHashTbl()->PidHashNameLen(_u("*"), sizeof("*") - 1);
    wellKnownPropertyPids._this = this->GetHashTbl()->PidHashNameLen(_u("*this*"), sizeof("*this*") - 1);
    wellKnownPropertyPids._newTarget = this->GetHashTbl()->PidHashNameLen(_u("*new.target*"), sizeof("*new.target*") - 1);
    wellKnownPropertyPids._super = this->GetHashTbl()->PidHashNameLen(_u("*super*"), sizeof("*super*") - 1);
    wellKnownPropertyPids._superConstructor = this->GetHashTbl()->PidHashNameLen(_u("*superconstructor*"), sizeof("*superconstructor*") - 1);
    wellKnownPropertyPids._importMeta = this->GetHashTbl()->PidHashNameLen(_u("*import.meta*"), sizeof("*import.meta*") - 1);
}